

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar1;
  ImGuiContext *pIVar2;
  ImGuiInputEvent *pIVar3;
  anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *paVar4;
  float local_28;
  ImGuiInputEvent e;
  
  pIVar2 = GImGui;
  if (this->AppAcceptingEvents == true) {
    if (-3.4028235e+38 < x) {
      x = ImFloorSigned(x);
    }
    local_28 = y;
    if (-3.4028235e+38 < y) {
      local_28 = ImFloorSigned(y);
    }
    pIVar3 = FindLatestInputEvent(ImGuiInputEventType_MousePos,-1);
    paVar4 = &pIVar3->field_2;
    paVar1 = &pIVar3->field_2;
    if (pIVar3 == (ImGuiInputEvent *)0x0) {
      paVar4 = (anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *)&(pIVar2->IO).MousePos;
      paVar1 = (anon_union_12_6_fccad779_for_ImGuiInputEvent_2 *)&(pIVar2->IO).MousePos;
    }
    if (((paVar4->MousePos).PosX == x) && (!NAN((paVar4->MousePos).PosX) && !NAN(x))) {
      if (((paVar1->MousePos).PosY == local_28) && (!NAN((paVar1->MousePos).PosY) && !NAN(local_28))
         ) {
        return;
      }
    }
    e._16_8_ = 0;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.field_2.MousePos.PosY = local_28;
    e.field_2.MousePos.PosX = x;
    ImVector<ImGuiInputEvent>::push_back(&pIVar2->InputEventsQueue,&e);
  }
  return;
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (!AppAcceptingEvents)
        return;

    // Apply same flooring as UpdateMouseInputs()
    ImVec2 pos((x > -FLT_MAX) ? ImFloorSigned(x) : x, (y > -FLT_MAX) ? ImFloorSigned(y) : y);

    // Filter duplicate
    const ImGuiInputEvent* latest_event = FindLatestInputEvent(ImGuiInputEventType_MousePos);
    const ImVec2 latest_pos = latest_event ? ImVec2(latest_event->MousePos.PosX, latest_event->MousePos.PosY) : g.IO.MousePos;
    if (latest_pos.x == pos.x && latest_pos.y == pos.y)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = pos.x;
    e.MousePos.PosY = pos.y;
    g.InputEventsQueue.push_back(e);
}